

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::DefaultSecretStorageSetting::SetGlobal
               (DatabaseInstance *db,DBConfig *config,Value *input)

{
  pointer pSVar1;
  string local_38;
  
  pSVar1 = unique_ptr<duckdb::SecretManager,_std::default_delete<duckdb::SecretManager>,_true>::
           operator->(&config->secret_manager);
  Value::ToString_abi_cxx11_(&local_38,input);
  (*pSVar1->_vptr_SecretManager[5])(pSVar1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DefaultSecretStorageSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.secret_manager->SetDefaultStorage(input.ToString());
}